

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_simcontext.cpp
# Opt level: O3

uint64 __thiscall sc_core::sc_simcontext::delta_count(sc_simcontext *this)

{
  if (delta_count()::warn_delta_count == '\0') {
    delta_count()::warn_delta_count = '\x01';
    sc_report_handler::report
              (SC_INFO,"/IEEE_Std_1666/deprecated",
               "sc_simcontext::delta_count() is deprecated, use sc_delta_count()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_simcontext.cpp"
               ,0x53e);
  }
  return this->m_delta_count;
}

Assistant:

sc_dt::uint64
sc_simcontext::delta_count() const
{
    static bool warn_delta_count=true;
    if ( warn_delta_count )
    {
	warn_delta_count = false;
	SC_REPORT_INFO(SC_ID_IEEE_1666_DEPRECATION_,
	    "sc_simcontext::delta_count() is deprecated, use sc_delta_count()" );
    }
    return m_delta_count;
}